

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

curl_socket_t Curl_getconnectinfo(Curl_easy *data,connectdata **connp)

{
  Curl_multi *pCVar1;
  conncache *local_48;
  connectdata *local_38;
  connfind find;
  connectdata *c;
  connectdata **connp_local;
  Curl_easy *data_local;
  
  if (((data->state).lastconnect == (connectdata *)0x0) ||
     ((data->multi_easy == (Curl_multi *)0x0 && (data->multi == (Curl_multi *)0x0)))) {
    data_local._4_4_ = -1;
  }
  else {
    find._8_8_ = (data->state).lastconnect;
    local_38 = (data->state).lastconnect;
    find.tofind._0_1_ = 0;
    if (data->multi_easy == (Curl_multi *)0x0) {
      pCVar1 = data->multi;
    }
    else {
      pCVar1 = data->multi_easy;
    }
    local_48 = &pCVar1->conn_cache;
    Curl_conncache_foreach(data,local_48,&local_38,conn_is_conn);
    if (((byte)find.tofind & 1) == 0) {
      (data->state).lastconnect = (connectdata *)0x0;
      data_local._4_4_ = -1;
    }
    else {
      if (connp != (connectdata **)0x0) {
        *connp = (connectdata *)find._8_8_;
        *(Curl_easy **)find._8_8_ = data;
      }
      data_local._4_4_ = *(curl_socket_t *)(find._8_8_ + 0x250);
    }
  }
  return data_local._4_4_;
}

Assistant:

curl_socket_t Curl_getconnectinfo(struct Curl_easy *data,
                                  struct connectdata **connp)
{
  DEBUGASSERT(data);

  /* this works for an easy handle:
   * - that has been used for curl_easy_perform()
   * - that is associated with a multi handle, and whose connection
   *   was detached with CURLOPT_CONNECT_ONLY
   */
  if(data->state.lastconnect && (data->multi_easy || data->multi)) {
    struct connectdata *c = data->state.lastconnect;
    struct connfind find;
    find.tofind = data->state.lastconnect;
    find.found = FALSE;

    Curl_conncache_foreach(data, data->multi_easy?
                           &data->multi_easy->conn_cache:
                           &data->multi->conn_cache, &find, conn_is_conn);

    if(!find.found) {
      data->state.lastconnect = NULL;
      return CURL_SOCKET_BAD;
    }

    if(connp) {
      /* only store this if the caller cares for it */
      *connp = c;
      c->data = data;
    }
    return c->sock[FIRSTSOCKET];
  }
  else
    return CURL_SOCKET_BAD;
}